

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * __thiscall BigInt::operator/(BigInt *__return_storage_ptr__,BigInt *this,longlong val)

{
  pair<BigInt,_long_long> local_48;
  longlong local_20;
  longlong val_local;
  BigInt *this_local;
  
  local_20 = val;
  val_local = (longlong)this;
  this_local = __return_storage_ptr__;
  divModValue(&local_48,this,val);
  BigInt(__return_storage_ptr__,&local_48.first);
  std::pair<BigInt,_long_long>::~pair(&local_48);
  return __return_storage_ptr__;
}

Assistant:

BigInt operator/(long long val) const { //! divide by val
        return divModValue(val).first;
    }